

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O3

SchemaResolution __thiscall
avro::
NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::SingleAttribute<int>_>
::furtherResolution(NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::NoAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::SingleAttribute<int>_>
                    *this,Node *reader)

{
  int iVar1;
  SchemaResolution SVar2;
  SchemaResolution SVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar4;
  
  if (reader->type_ == AVRO_NUM_TYPES) {
    iVar1 = (*reader->_vptr_Node[5])(reader,0);
    SVar3 = (*(this->super_Node)._vptr_Node[0xc])
                      (this,*(undefined8 *)CONCAT44(extraout_var_02,iVar1));
    return SVar3;
  }
  SVar3 = RESOLVE_NO_MATCH;
  if ((reader->type_ == AVRO_UNION) &&
     (iVar1 = (*reader->_vptr_Node[4])(reader), SVar3 = RESOLVE_NO_MATCH,
     CONCAT44(extraout_var,iVar1) != 0)) {
    SVar3 = RESOLVE_NO_MATCH;
    uVar4 = 0;
    do {
      iVar1 = (*reader->_vptr_Node[5])(reader,uVar4 & 0xffffffff);
      SVar2 = (*(this->super_Node)._vptr_Node[0xc])
                        (this,*(undefined8 *)CONCAT44(extraout_var_00,iVar1));
      if (SVar2 == RESOLVE_MATCH) {
        return RESOLVE_MATCH;
      }
      if (SVar3 == RESOLVE_NO_MATCH) {
        SVar3 = SVar2;
      }
      uVar4 = uVar4 + 1;
      iVar1 = (*reader->_vptr_Node[4])(reader);
    } while (uVar4 < CONCAT44(extraout_var_01,iVar1));
  }
  return SVar3;
}

Assistant:

SchemaResolution furtherResolution(const Node &reader) const {
        SchemaResolution match = RESOLVE_NO_MATCH;

        if (reader.type() == AVRO_SYMBOLIC) {
    
            // resolve the symbolic type, and check again
            const NodePtr &node = reader.leafAt(0);
            match = resolve(*node);
        }
        else if(reader.type() == AVRO_UNION) {

            // in this case, need to see if there is an exact match for the
            // writer's type, or if not, the first one that can be promoted to a
            // match
        
            for(size_t i= 0; i < reader.leaves(); ++i)  {

                const NodePtr &node = reader.leafAt(i);
                SchemaResolution thisMatch = resolve(*node);

                // if matched then the search is done
                if(thisMatch == RESOLVE_MATCH) {
                    match = thisMatch;
                    break;
                }

                // thisMatch is either no match, or promotable, this will set match to 
                // promotable if it hasn't been set already
                if (match == RESOLVE_NO_MATCH) {
                    match = thisMatch;
                }
            }
        }

        return match;
    }